

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::uncheckedEnqueue(Solver *this,Lit p,CRef from)

{
  CRef cr;
  bool bVar1;
  int iVar2;
  lbool *plVar3;
  VarData VVar4;
  VarData *pVVar5;
  uchar *in_RCX;
  size_t *siglen;
  uchar *sig;
  size_t in_R8;
  lbool local_26;
  uint8_t local_25;
  int local_24;
  lbool local_1d;
  CRef local_1c;
  Solver *pSStack_18;
  CRef from_local;
  Solver *this_local;
  Lit p_local;
  
  local_24 = p.x;
  local_1c = from;
  pSStack_18 = this;
  this_local._4_4_ = p.x;
  local_1d = value(this,p);
  local_25 = l_Undef.value;
  sig = (uchar *)(ulong)l_Undef.value;
  bVar1 = lbool::operator==(&local_1d,l_Undef);
  if (!bVar1) {
    __assert_fail("value(p) == l_Undef",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/core/Solver.cc"
                  ,0x1e8,"void Minisat::Solver::uncheckedEnqueue(Lit, CRef)");
  }
  iVar2 = sign((EVP_PKEY_CTX *)(ulong)(uint)this_local._4_4_,sig,siglen,in_RCX,in_R8);
  lbool::lbool(&local_26,(bool)(((byte)iVar2 ^ 0xff) & 1));
  iVar2 = var(this_local._4_4_);
  plVar3 = IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>::operator[]
                     (&(this->assigns).
                       super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>,iVar2);
  cr = local_1c;
  plVar3->value = local_26.value;
  iVar2 = decisionLevel(this);
  VVar4 = mkVarData(cr,iVar2);
  iVar2 = var(this_local._4_4_);
  pVVar5 = IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>::operator[]
                     (&(this->vardata).
                       super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>,
                      iVar2);
  *pVVar5 = VVar4;
  vec<Minisat::Lit,_int>::push_(&this->trail,(Lit *)((long)&this_local + 4));
  return;
}

Assistant:

void Solver::uncheckedEnqueue(Lit p, CRef from)
{
    assert(value(p) == l_Undef);
    assigns[var(p)] = lbool(!sign(p));
    vardata[var(p)] = mkVarData(from, decisionLevel());
    trail.push_(p);
}